

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vmaskmovpd_(PDISASM pMyDisasm)

{
  char *pcVar1;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        builtin_strncpy(pcVar1,"vscalefss",10);
      }
      else {
        builtin_strncpy(pcVar1,"vscalefsd",10);
      }
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xd1;
      GyEy(pMyDisasm);
      return;
    }
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmaskmovpd",0xb);
    ArgsVEX(pMyDisasm);
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    return;
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vmaskmovpd_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vscalefss");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vscalefsd");
        #endif
      }
      GV.EVEX.tupletype = TUPLE1_SCALAR;
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.Register_ = SSE_REG;
      GV.MemDecoration = Arg3_m128_xmm;
      GyEy(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmaskmovpd");
    #endif
    ArgsVEX(pMyDisasm);
    if (GV.REX.W_ == 1) GV.ERROR_OPCODE = UD_;
  }
  else {
    failDecode(pMyDisasm);
  }
}